

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  bool bVar1;
  UnitTestImpl *this_00;
  UnitTest *this_01;
  TestEventListeners *this_02;
  TimeInMillis TVar2;
  OsStackTraceGetterInterface *pOVar3;
  Test *this_03;
  Test *test;
  Timer timer;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestInfo *this_local;
  
  if ((this->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_info(this_00,this);
    this_01 = UnitTest::GetInstance();
    this_02 = UnitTest::listeners(this_01);
    timer.start_.__d.__r = (time_point)TestEventListeners::repeater(this_02);
    (*(*(_func_int ***)timer.start_.__d.__r)[8])(timer.start_.__d.__r,this);
    TVar2 = internal::GetTimeInMillis();
    TestResult::set_start_timestamp(&this->result_,TVar2);
    internal::Timer::Timer((Timer *)&test);
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
    this_03 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    bVar1 = Test::HasFatalFailure();
    if ((!bVar1) && (bVar1 = Test::IsSkipped(), !bVar1)) {
      Test::Run(this_03);
    }
    if (this_03 != (Test *)0x0) {
      pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
      (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                (this_03,0x14ecf0,(char *)0x0);
    }
    TVar2 = internal::Timer::Elapsed((Timer *)&test);
    TestResult::set_elapsed_time(&this->result_,TVar2);
    (**(code **)(*(long *)timer.start_.__d.__r + 0x50))(timer.start_.__d.__r,this);
    internal::UnitTestImpl::set_current_test_info(this_00,(TestInfo *)0x0);
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  result_.set_start_timestamp(internal::GetTimeInMillis());
  internal::Timer timer;

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_elapsed_time(timer.Elapsed());

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(nullptr);
}